

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O0

void __thiscall
bssl::anon_unknown_0::SSLVersionTest_KeyLog_Test::TestBody(SSLVersionTest_KeyLog_Test *this)

{
  size_t *this_00;
  allocator<unsigned_char> *this_01;
  ElementsAreMatcher<std::tuple<testing::internal::KeyMatcher<const_char_*>,_testing::internal::KeyMatcher<const_char_*>,_testing::internal::KeyMatcher<const_char_*>,_testing::internal::KeyMatcher<const_char_*>,_testing::internal::KeyMatcher<const_char_*>_>_>
  matcher;
  Span<const_unsigned_char> span;
  Span<const_unsigned_char> span_00;
  bool bVar1;
  pointer psVar2;
  _func_void_SSL_ptr_char_ptr *p_Var3;
  char *pcVar4;
  pointer psVar5;
  SSL *pSVar6;
  SSL_SESSION *pSVar7;
  pointer __n;
  uchar *out;
  size_type max_out;
  mapped_type *pmVar8;
  char *in_R9;
  KeyMatcher<const_char_*> *matchers_3;
  KeyMatcher<const_char_*> *in_stack_fffffffffffff968;
  _Head_base<0UL,_testing::internal::KeyMatcher<const_char_*>,_false> in_stack_fffffffffffff970;
  _Head_base<0UL,_testing::internal::KeyMatcher<const_char_*>,_false> in_stack_fffffffffffff990;
  AssertHelper local_548;
  Message local_540;
  undefined1 local_538 [8];
  AssertionResult gtest_ar_6;
  Message local_520;
  allocator<char> local_511;
  key_type local_510;
  Span<const_unsigned_char> local_4f0;
  Bytes local_4e0;
  Span<const_unsigned_char> local_4d0;
  Bytes local_4c0;
  undefined1 local_4b0 [8];
  AssertionResult gtest_ar_5;
  Message local_498;
  size_type local_490;
  size_t local_488;
  undefined1 local_480 [8];
  AssertionResult gtest_ar_4;
  undefined1 local_468 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> expected;
  size_t len_1;
  Message local_440;
  KeyMatcher<const_char_*> local_438;
  testing local_430 [8];
  char local_428 [8];
  undefined1 local_420 [8];
  AssertionResult gtest_ar_3;
  Message local_408;
  allocator<char> local_3f9;
  key_type local_3f8;
  Span<const_unsigned_char> local_3d8;
  Bytes local_3c8;
  uint8_t *local_3b8;
  uchar *puStack_3b0;
  Bytes local_3a0;
  undefined1 local_390 [8];
  AssertionResult gtest_ar_2;
  Message local_378;
  allocator<char> local_369;
  key_type local_368;
  Span<const_unsigned_char> local_348;
  Bytes local_338;
  size_t local_328;
  uchar *puStack_320;
  Bytes local_310;
  undefined1 local_300 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_2d0;
  Message local_2c8;
  bool local_2b9;
  undefined1 local_2b8 [8];
  AssertionResult gtest_ar__3;
  uchar *local_2a0;
  string local_298;
  AssertHelper local_278;
  Message local_270;
  int local_264;
  undefined1 local_260 [8];
  AssertionResult gtest_ar__2;
  uchar *puStack_248;
  string local_240;
  AssertHelper local_220;
  Message local_218;
  int local_20c;
  undefined1 local_208 [8];
  AssertionResult gtest_ar__1;
  size_t len;
  uint8_t *data;
  Span<const_unsigned_char> write_secret;
  Span<const_unsigned_char> read_secret;
  Message local_1c0;
  KeyMatcher<const_char_*> local_1b8;
  KeyMatcher<const_char_*> local_1b0;
  KeyMatcher<const_char_*> local_1a8;
  KeyMatcher<const_char_*> local_1a0;
  char *local_198;
  ElementsAreMatcher<std::tuple<testing::internal::KeyMatcher<const_char_*>,_testing::internal::KeyMatcher<const_char_*>,_testing::internal::KeyMatcher<const_char_*>,_testing::internal::KeyMatcher<const_char_*>,_testing::internal::KeyMatcher<const_char_*>_>_>
  local_190;
  char local_168 [40];
  undefined1 local_140 [8];
  AssertionResult gtest_ar;
  string local_128;
  AssertHelper local_108;
  Message local_100;
  ClientConfig local_f8;
  bool local_91;
  undefined1 local_90 [8];
  AssertionResult gtest_ar_;
  anon_class_1_0_00000001 keylog_callback;
  undefined1 local_70 [8];
  KeyLog server_log;
  KeyLog client_log;
  SSLVersionTest_KeyLog_Test *this_local;
  
  this_00 = &server_log._M_t._M_impl.super__Rb_tree_header._M_node_count;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
         *)this_00);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
         *)local_70);
  psVar2 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                     (&(this->super_SSLVersionTest).client_ctx_);
  SSL_CTX_set_ex_data((SSL_CTX *)psVar2,0,this_00);
  psVar2 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                     (&(this->super_SSLVersionTest).server_ctx_);
  SSL_CTX_set_ex_data((SSL_CTX *)psVar2,0,local_70);
  psVar2 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                     (&(this->super_SSLVersionTest).client_ctx_);
  p_Var3 = (anonymous_namespace)::SSLVersionTest_KeyLog_Test::TestBody()::$_0::
           operator_cast_to_function_pointer
                     ((__0 *)((long)&gtest_ar_.message_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             + 3));
  SSL_CTX_set_keylog_callback(psVar2,p_Var3);
  psVar2 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                     (&(this->super_SSLVersionTest).server_ctx_);
  p_Var3 = (anonymous_namespace)::SSLVersionTest_KeyLog_Test::TestBody()::$_0::
           operator_cast_to_function_pointer
                     ((__0 *)((long)&gtest_ar_.message_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             + 3));
  SSL_CTX_set_keylog_callback(psVar2,p_Var3);
  local_f8.verify_hostname.field_2._M_allocated_capacity = 0;
  local_f8.verify_hostname.field_2._8_8_ = 0;
  local_f8.verify_hostname._M_dataplus = (_Alloc_hider)0x0;
  local_f8.verify_hostname._1_7_ = 0;
  local_f8.verify_hostname._M_string_length = 0;
  local_f8.servername.field_2._M_allocated_capacity = 0;
  local_f8.servername.field_2._8_8_ = 0;
  local_f8.servername._M_dataplus = (_Alloc_hider)0x0;
  local_f8.servername._1_7_ = 0;
  local_f8.servername._M_string_length = 0;
  local_f8.session = (SSL_SESSION *)0x0;
  local_f8.ca_names = (stack_st_CRYPTO_BUFFER *)0x0;
  local_f8.hostflags = 0;
  local_f8.early_data = false;
  local_f8._85_3_ = 0;
  ClientConfig::ClientConfig(&local_f8);
  local_91 = SSLVersionTest::Connect(&this->super_SSLVersionTest,&local_f8);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_90,&local_91,(type *)0x0)
  ;
  ClientConfig::~ClientConfig(&local_f8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
  if (!bVar1) {
    testing::Message::Message(&local_100);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_128,(internal *)local_90,(AssertionResult *)"Connect()","false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x26cb,pcVar4);
    testing::internal::AssertHelper::operator=(&local_108,&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    std::__cxx11::string::~string((string *)&local_128);
    testing::Message::~Message(&local_100);
  }
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
  if (gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ != 0) goto LAB_00267e21;
  bVar1 = SSLVersionTest::is_tls13(&this->super_SSLVersionTest);
  if (bVar1) {
    local_198 = (char *)testing::Key<char_const*>("CLIENT_HANDSHAKE_TRAFFIC_SECRET");
    local_1a0 = testing::Key<char_const*>("CLIENT_TRAFFIC_SECRET_0");
    local_1a8 = testing::Key<char_const*>("EXPORTER_SECRET");
    local_1b0 = testing::Key<char_const*>("SERVER_HANDSHAKE_TRAFFIC_SECRET");
    local_1b8 = testing::Key<char_const*>("SERVER_TRAFFIC_SECRET_0");
    matchers_3 = &local_1b8;
    testing::
    ElementsAre<testing::internal::KeyMatcher<char_const*>,testing::internal::KeyMatcher<char_const*>,testing::internal::KeyMatcher<char_const*>,testing::internal::KeyMatcher<char_const*>,testing::internal::KeyMatcher<char_const*>>
              (&local_190,(testing *)&local_198,&local_1a0,&local_1a8,&local_1b0,matchers_3,
               in_stack_fffffffffffff968);
    matcher.matchers_.
    super__Tuple_impl<0UL,_testing::internal::KeyMatcher<const_char_*>,_testing::internal::KeyMatcher<const_char_*>,_testing::internal::KeyMatcher<const_char_*>,_testing::internal::KeyMatcher<const_char_*>,_testing::internal::KeyMatcher<const_char_*>_>
    .
    super__Tuple_impl<1UL,_testing::internal::KeyMatcher<const_char_*>,_testing::internal::KeyMatcher<const_char_*>,_testing::internal::KeyMatcher<const_char_*>,_testing::internal::KeyMatcher<const_char_*>_>
    .
    super__Tuple_impl<2UL,_testing::internal::KeyMatcher<const_char_*>,_testing::internal::KeyMatcher<const_char_*>,_testing::internal::KeyMatcher<const_char_*>_>
    .
    super__Tuple_impl<3UL,_testing::internal::KeyMatcher<const_char_*>,_testing::internal::KeyMatcher<const_char_*>_>
    .super__Head_base<3UL,_testing::internal::KeyMatcher<const_char_*>,_false>._M_head_impl.
    matcher_for_key_ =
         local_190.matchers_.
         super__Tuple_impl<0UL,_testing::internal::KeyMatcher<const_char_*>,_testing::internal::KeyMatcher<const_char_*>,_testing::internal::KeyMatcher<const_char_*>,_testing::internal::KeyMatcher<const_char_*>,_testing::internal::KeyMatcher<const_char_*>_>
         .
         super__Tuple_impl<1UL,_testing::internal::KeyMatcher<const_char_*>,_testing::internal::KeyMatcher<const_char_*>,_testing::internal::KeyMatcher<const_char_*>,_testing::internal::KeyMatcher<const_char_*>_>
         .
         super__Tuple_impl<2UL,_testing::internal::KeyMatcher<const_char_*>,_testing::internal::KeyMatcher<const_char_*>,_testing::internal::KeyMatcher<const_char_*>_>
         .super__Head_base<2UL,_testing::internal::KeyMatcher<const_char_*>,_false>._M_head_impl.
         matcher_for_key_;
    matcher.matchers_.
    super__Tuple_impl<0UL,_testing::internal::KeyMatcher<const_char_*>,_testing::internal::KeyMatcher<const_char_*>,_testing::internal::KeyMatcher<const_char_*>,_testing::internal::KeyMatcher<const_char_*>,_testing::internal::KeyMatcher<const_char_*>_>
    .
    super__Tuple_impl<1UL,_testing::internal::KeyMatcher<const_char_*>,_testing::internal::KeyMatcher<const_char_*>,_testing::internal::KeyMatcher<const_char_*>,_testing::internal::KeyMatcher<const_char_*>_>
    .
    super__Tuple_impl<2UL,_testing::internal::KeyMatcher<const_char_*>,_testing::internal::KeyMatcher<const_char_*>,_testing::internal::KeyMatcher<const_char_*>_>
    .
    super__Tuple_impl<3UL,_testing::internal::KeyMatcher<const_char_*>,_testing::internal::KeyMatcher<const_char_*>_>
    .super__Tuple_impl<4UL,_testing::internal::KeyMatcher<const_char_*>_>.
    super__Head_base<4UL,_testing::internal::KeyMatcher<const_char_*>,_false>._M_head_impl.
    matcher_for_key_ =
         (_Head_base<4UL,_testing::internal::KeyMatcher<const_char_*>,_false>)
         (_Head_base<4UL,_testing::internal::KeyMatcher<const_char_*>,_false>)
         local_190.matchers_.
         super__Tuple_impl<0UL,_testing::internal::KeyMatcher<const_char_*>,_testing::internal::KeyMatcher<const_char_*>,_testing::internal::KeyMatcher<const_char_*>,_testing::internal::KeyMatcher<const_char_*>,_testing::internal::KeyMatcher<const_char_*>_>
         .
         super__Tuple_impl<1UL,_testing::internal::KeyMatcher<const_char_*>,_testing::internal::KeyMatcher<const_char_*>,_testing::internal::KeyMatcher<const_char_*>,_testing::internal::KeyMatcher<const_char_*>_>
         .
         super__Tuple_impl<2UL,_testing::internal::KeyMatcher<const_char_*>,_testing::internal::KeyMatcher<const_char_*>,_testing::internal::KeyMatcher<const_char_*>_>
         .
         super__Tuple_impl<3UL,_testing::internal::KeyMatcher<const_char_*>,_testing::internal::KeyMatcher<const_char_*>_>
         .super__Head_base<3UL,_testing::internal::KeyMatcher<const_char_*>,_false>._M_head_impl.
         matcher_for_key_;
    matcher.matchers_.
    super__Tuple_impl<0UL,_testing::internal::KeyMatcher<const_char_*>,_testing::internal::KeyMatcher<const_char_*>,_testing::internal::KeyMatcher<const_char_*>,_testing::internal::KeyMatcher<const_char_*>,_testing::internal::KeyMatcher<const_char_*>_>
    .
    super__Tuple_impl<1UL,_testing::internal::KeyMatcher<const_char_*>,_testing::internal::KeyMatcher<const_char_*>,_testing::internal::KeyMatcher<const_char_*>,_testing::internal::KeyMatcher<const_char_*>_>
    .
    super__Tuple_impl<2UL,_testing::internal::KeyMatcher<const_char_*>,_testing::internal::KeyMatcher<const_char_*>,_testing::internal::KeyMatcher<const_char_*>_>
    .super__Head_base<2UL,_testing::internal::KeyMatcher<const_char_*>,_false>._M_head_impl.
    matcher_for_key_ =
         local_190.matchers_.
         super__Tuple_impl<0UL,_testing::internal::KeyMatcher<const_char_*>,_testing::internal::KeyMatcher<const_char_*>,_testing::internal::KeyMatcher<const_char_*>,_testing::internal::KeyMatcher<const_char_*>,_testing::internal::KeyMatcher<const_char_*>_>
         .
         super__Tuple_impl<1UL,_testing::internal::KeyMatcher<const_char_*>,_testing::internal::KeyMatcher<const_char_*>,_testing::internal::KeyMatcher<const_char_*>,_testing::internal::KeyMatcher<const_char_*>_>
         .super__Head_base<1UL,_testing::internal::KeyMatcher<const_char_*>,_false>._M_head_impl.
         matcher_for_key_;
    matcher.matchers_.
    super__Tuple_impl<0UL,_testing::internal::KeyMatcher<const_char_*>,_testing::internal::KeyMatcher<const_char_*>,_testing::internal::KeyMatcher<const_char_*>,_testing::internal::KeyMatcher<const_char_*>,_testing::internal::KeyMatcher<const_char_*>_>
    .
    super__Tuple_impl<1UL,_testing::internal::KeyMatcher<const_char_*>,_testing::internal::KeyMatcher<const_char_*>,_testing::internal::KeyMatcher<const_char_*>,_testing::internal::KeyMatcher<const_char_*>_>
    .super__Head_base<1UL,_testing::internal::KeyMatcher<const_char_*>,_false>._M_head_impl.
    matcher_for_key_ =
         local_190.matchers_.
         super__Tuple_impl<0UL,_testing::internal::KeyMatcher<const_char_*>,_testing::internal::KeyMatcher<const_char_*>,_testing::internal::KeyMatcher<const_char_*>,_testing::internal::KeyMatcher<const_char_*>,_testing::internal::KeyMatcher<const_char_*>_>
         .super__Head_base<0UL,_testing::internal::KeyMatcher<const_char_*>,_false>._M_head_impl.
         matcher_for_key_;
    matcher.matchers_.
    super__Tuple_impl<0UL,_testing::internal::KeyMatcher<const_char_*>,_testing::internal::KeyMatcher<const_char_*>,_testing::internal::KeyMatcher<const_char_*>,_testing::internal::KeyMatcher<const_char_*>,_testing::internal::KeyMatcher<const_char_*>_>
    .super__Head_base<0UL,_testing::internal::KeyMatcher<const_char_*>,_false>._M_head_impl.
    matcher_for_key_ = in_stack_fffffffffffff990._M_head_impl.matcher_for_key_;
    testing::internal::
    MakePredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<testing::internal::KeyMatcher<char_const*>,testing::internal::KeyMatcher<char_const*>,testing::internal::KeyMatcher<char_const*>,testing::internal::KeyMatcher<char_const*>,testing::internal::KeyMatcher<char_const*>>>>
              (matcher);
    testing::internal::
    PredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<testing::internal::KeyMatcher<char_const*>,testing::internal::KeyMatcher<char_const*>,testing::internal::KeyMatcher<char_const*>,testing::internal::KeyMatcher<char_const*>,testing::internal::KeyMatcher<char_const*>>>>
    ::operator()(local_140,local_168,
                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                  *)"client_log");
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_140);
    if (!bVar1) {
      testing::Message::Message(&local_1c0);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_140);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&read_secret.size_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x26d3,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&read_secret.size_,&local_1c0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&read_secret.size_);
      testing::Message::~Message(&local_1c0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_140);
    Span<const_unsigned_char>::Span((Span<const_unsigned_char> *)&write_secret.size_);
    Span<const_unsigned_char>::Span((Span<const_unsigned_char> *)&data);
    bVar1 = SSLVersionTest::is_dtls(&this->super_SSLVersionTest);
    if (bVar1) {
      psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                         (&(this->super_SSLVersionTest).client_);
      local_20c = SSL_get_dtls_read_traffic_secret
                            (psVar5,(uint8_t **)&len,(size_t *)&gtest_ar__1.message_,3);
      testing::AssertionResult::AssertionResult<int>
                ((AssertionResult *)local_208,&local_20c,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_208);
      if (!bVar1) {
        testing::Message::Message(&local_218);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_240,(internal *)local_208,
                   (AssertionResult *)
                   "SSL_get_dtls_read_traffic_secret(client_.get(), &data, &len, 3)","false","true",
                   (char *)matchers_3);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_220,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x26db,pcVar4);
        testing::internal::AssertHelper::operator=(&local_220,&local_218);
        testing::internal::AssertHelper::~AssertHelper(&local_220);
        std::__cxx11::string::~string((string *)&local_240);
        testing::Message::~Message(&local_218);
      }
      gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._5_3_ = 0;
      gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_208);
      if (gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ != 0) goto LAB_00267e21;
      Span<const_unsigned_char>::Span
                ((Span<const_unsigned_char> *)&gtest_ar__2.message_,(uchar *)len,
                 (size_t)gtest_ar__1.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl);
      write_secret.size_ =
           (size_t)gtest_ar__2.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl;
      read_secret.data_ = puStack_248;
      psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                         (&(this->super_SSLVersionTest).client_);
      local_264 = SSL_get_dtls_write_traffic_secret
                            (psVar5,(uint8_t **)&len,(size_t *)&gtest_ar__1.message_,3);
      testing::AssertionResult::AssertionResult<int>
                ((AssertionResult *)local_260,&local_264,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_260);
      if (!bVar1) {
        testing::Message::Message(&local_270);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_298,(internal *)local_260,
                   (AssertionResult *)
                   "SSL_get_dtls_write_traffic_secret(client_.get(), &data, &len, 3)","false","true"
                   ,(char *)matchers_3);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_278,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x26de,pcVar4);
        testing::internal::AssertHelper::operator=(&local_278,&local_270);
        testing::internal::AssertHelper::~AssertHelper(&local_278);
        std::__cxx11::string::~string((string *)&local_298);
        testing::Message::~Message(&local_270);
      }
      gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._5_3_ = 0;
      gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_260);
      if (gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ != 0) goto LAB_00267e21;
      Span<const_unsigned_char>::Span
                ((Span<const_unsigned_char> *)&gtest_ar__3.message_,(uchar *)len,
                 (size_t)gtest_ar__1.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl);
      data = (uint8_t *)
             gtest_ar__3.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl;
      write_secret.data_ = local_2a0;
    }
    else {
      psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                         (&(this->super_SSLVersionTest).client_);
      local_2b9 = SSL_get_traffic_secrets
                            (psVar5,(Span<const_unsigned_char> *)&write_secret.size_,
                             (Span<const_unsigned_char> *)&data);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_2b8,&local_2b9,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2b8);
      if (!bVar1) {
        testing::Message::Message(&local_2c8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar_1.message_,(internal *)local_2b8,
                   (AssertionResult *)
                   "SSL_get_traffic_secrets(client_.get(), &read_secret, &write_secret)","false",
                   "true",(char *)matchers_3);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_2d0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x26e2,pcVar4);
        testing::internal::AssertHelper::operator=(&local_2d0,&local_2c8);
        testing::internal::AssertHelper::~AssertHelper(&local_2d0);
        std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
        testing::Message::~Message(&local_2c8);
      }
      gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._5_3_ = 0;
      gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_2b8);
      if (gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ != 0) goto LAB_00267e21;
    }
    local_328 = write_secret.size_;
    puStack_320 = read_secret.data_;
    span_00.size_ = (size_t)read_secret.data_;
    span_00.data_ = (uchar *)write_secret.size_;
    Bytes::Bytes(&local_310,span_00);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_368,"SERVER_TRAFFIC_SECRET_0",&local_369);
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                           *)&server_log._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_368
                         );
    Span<unsigned_char_const>::
    Span<std::vector<unsigned_char,std::allocator<unsigned_char>>,void,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ((Span<unsigned_char_const> *)&local_348,pmVar8);
    Bytes::Bytes(&local_338,local_348);
    testing::internal::EqHelper::Compare<Bytes,_Bytes,_nullptr>
              ((EqHelper *)local_300,"Bytes(read_secret)",
               "Bytes(client_log[\"SERVER_TRAFFIC_SECRET_0\"])",&local_310,&local_338);
    std::__cxx11::string::~string((string *)&local_368);
    std::allocator<char>::~allocator(&local_369);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_300);
    if (!bVar1) {
      testing::Message::Message(&local_378);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_300);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x26e6,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_378);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_378);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_300);
    local_3b8 = data;
    puStack_3b0 = write_secret.data_;
    span.size_ = (size_t)write_secret.data_;
    span.data_ = data;
    Bytes::Bytes(&local_3a0,span);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3f8,"CLIENT_TRAFFIC_SECRET_0",&local_3f9);
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                           *)&server_log._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_3f8
                         );
    Span<unsigned_char_const>::
    Span<std::vector<unsigned_char,std::allocator<unsigned_char>>,void,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ((Span<unsigned_char_const> *)&local_3d8,pmVar8);
    Bytes::Bytes(&local_3c8,local_3d8);
    testing::internal::EqHelper::Compare<Bytes,_Bytes,_nullptr>
              ((EqHelper *)local_390,"Bytes(write_secret)",
               "Bytes(client_log[\"CLIENT_TRAFFIC_SECRET_0\"])",&local_3a0,&local_3c8);
    std::__cxx11::string::~string((string *)&local_3f8);
    std::allocator<char>::~allocator(&local_3f9);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_390);
    if (!bVar1) {
      testing::Message::Message(&local_408);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_390);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x26e8,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_408);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
      testing::Message::~Message(&local_408);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_390);
  }
  else {
    local_438 = testing::Key<char_const*>("CLIENT_RANDOM");
    testing::ElementsAre<testing::internal::KeyMatcher<char_const*>>(local_430,&local_438);
    testing::internal::
    MakePredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<testing::internal::KeyMatcher<char_const*>>>>
              ((ElementsAreMatcher<std::tuple<testing::internal::KeyMatcher<const_char_*>_>_>)
               in_stack_fffffffffffff970._M_head_impl.matcher_for_key_);
    testing::internal::
    PredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<testing::internal::KeyMatcher<char_const*>>>>
    ::operator()(local_420,local_428,
                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                  *)"client_log");
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_420);
    if (!bVar1) {
      testing::Message::Message(&local_440);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_420);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&len_1,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x26ea,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&len_1,&local_440);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&len_1);
      testing::Message::~Message(&local_440);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_420);
    pSVar6 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                              (&(this->super_SSLVersionTest).client_);
    pSVar7 = SSL_get_session(pSVar6);
    __n = (pointer)SSL_SESSION_get_master_key((SSL_SESSION *)pSVar7,(uint8_t *)0x0,0);
    this_01 = (allocator<unsigned_char> *)
              ((long)&gtest_ar_4.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              + 7);
    expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = __n;
    std::allocator<unsigned_char>::allocator(this_01);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_468,(size_type)__n,
               this_01);
    std::allocator<unsigned_char>::~allocator
              ((allocator<unsigned_char> *)
               ((long)&gtest_ar_4.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               + 7));
    pSVar6 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                              (&(this->super_SSLVersionTest).client_);
    pSVar7 = SSL_get_session(pSVar6);
    out = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_468);
    max_out = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_468);
    local_488 = SSL_SESSION_get_master_key((SSL_SESSION *)pSVar7,out,max_out);
    local_490 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_468);
    testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
              ((EqHelper *)local_480,
               "SSL_SESSION_get_master_key(SSL_get_session(client_.get()), expected.data(), expected.size())"
               ,"expected.size()",&local_488,&local_490);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_480);
    if (!bVar1) {
      testing::Message::Message(&local_498);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_480);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_5.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x26f1,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_498);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
      testing::Message::~Message(&local_498);
    }
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_480);
    if (gtest_ar.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ == 0) {
      Span<unsigned_char_const>::
      Span<std::vector<unsigned_char,std::allocator<unsigned_char>>,void,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ((Span<unsigned_char_const> *)&local_4d0,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_468);
      Bytes::Bytes(&local_4c0,local_4d0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_510,"CLIENT_RANDOM",&local_511);
      pmVar8 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                             *)&server_log._M_t._M_impl.super__Rb_tree_header._M_node_count,
                            &local_510);
      Span<unsigned_char_const>::
      Span<std::vector<unsigned_char,std::allocator<unsigned_char>>,void,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ((Span<unsigned_char_const> *)&local_4f0,pmVar8);
      Bytes::Bytes(&local_4e0,local_4f0);
      testing::internal::EqHelper::Compare<Bytes,_Bytes,_nullptr>
                ((EqHelper *)local_4b0,"Bytes(expected)","Bytes(client_log[\"CLIENT_RANDOM\"])",
                 &local_4c0,&local_4e0);
      std::__cxx11::string::~string((string *)&local_510);
      std::allocator<char>::~allocator(&local_511);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4b0);
      if (!bVar1) {
        testing::Message::Message(&local_520);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_4b0);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x26f2,pcVar4);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_520);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
        testing::Message::~Message(&local_520);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_4b0);
      gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ = 0;
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_468);
    if (gtest_ar.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ != 0) goto LAB_00267e21;
  }
  testing::internal::EqHelper::
  Compare<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>,_nullptr>
            ((EqHelper *)local_538,"client_log","server_log",
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
              *)&server_log._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
              *)local_70);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_538);
  if (!bVar1) {
    testing::Message::Message(&local_540);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_538);
    testing::internal::AssertHelper::AssertHelper
              (&local_548,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x26f6,pcVar4);
    testing::internal::AssertHelper::operator=(&local_548,&local_540);
    testing::internal::AssertHelper::~AssertHelper(&local_548);
    testing::Message::~Message(&local_540);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_538);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_4_ = 0;
LAB_00267e21:
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
          *)local_70);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
          *)&server_log._M_t._M_impl.super__Rb_tree_header._M_node_count);
  return;
}

Assistant:

TEST_P(SSLVersionTest, KeyLog) {
  using KeyLog = std::map<std::string, std::vector<uint8_t>>;
  KeyLog client_log, server_log;

  SSL_CTX_set_app_data(client_ctx_.get(), &client_log);
  SSL_CTX_set_app_data(server_ctx_.get(), &server_log);

  auto keylog_callback = [](const SSL *ssl, const char *line) {
    SSL_CTX *ctx = SSL_get_SSL_CTX(ssl);
    KeyLog *log = static_cast<KeyLog *>(SSL_CTX_get_app_data(ctx));
    ASSERT_TRUE(log);

    const char *space1 = strchr(line, ' ');
    ASSERT_TRUE(space1);
    std::string name(line, space1 - line);
    space1++;
    const char *space2 = strchr(space1, ' ');
    ASSERT_TRUE(space2);
    bssl::Span<const char> client_random_hex(space1, space2 - space1);
    space2++;
    bssl::Span<const char> secret_hex(space2, strlen(space2));

    std::vector<uint8_t> client_random, secret;
    ASSERT_TRUE(DecodeLowerHex(&client_random, client_random_hex));
    ASSERT_TRUE(DecodeLowerHex(&secret, secret_hex));

    // The client_random field identifies the connection. Check it matches
    // the connection.
    uint8_t expected_random[SSL3_RANDOM_SIZE];
    ASSERT_EQ(
        sizeof(expected_random),
        SSL_get_client_random(ssl, expected_random, sizeof(expected_random)));
    ASSERT_EQ(Bytes(expected_random), Bytes(client_random));

    ASSERT_EQ(log->count(name), 0u) << "duplicate name " << name;
    log->emplace(std::move(name), std::move(secret));
  };
  SSL_CTX_set_keylog_callback(client_ctx_.get(), keylog_callback);
  SSL_CTX_set_keylog_callback(server_ctx_.get(), keylog_callback);

  // Connect and capture the various secrets.
  ASSERT_TRUE(Connect());

  // Check that we logged the secrets we expected to log.
  if (is_tls13()) {
    EXPECT_THAT(client_log, ElementsAre(Key("CLIENT_HANDSHAKE_TRAFFIC_SECRET"),
                                        Key("CLIENT_TRAFFIC_SECRET_0"),
                                        Key("EXPORTER_SECRET"),
                                        Key("SERVER_HANDSHAKE_TRAFFIC_SECRET"),
                                        Key("SERVER_TRAFFIC_SECRET_0")));

    Span<const uint8_t> read_secret, write_secret;
    if (is_dtls()) {
      // The first application data epoch is 3.
      const uint8_t *data;
      size_t len;
      ASSERT_TRUE(SSL_get_dtls_read_traffic_secret(client_.get(), &data, &len,
                                                   /*epoch=*/3));
      read_secret = Span(data, len);
      ASSERT_TRUE(SSL_get_dtls_write_traffic_secret(client_.get(), &data, &len,
                                                   /*epoch=*/3));
      write_secret = Span(data, len);
    } else {
      ASSERT_TRUE(
          SSL_get_traffic_secrets(client_.get(), &read_secret, &write_secret));
    }
    // Ideally we'd check the other values, but those are harder to check
    // without actually decrypting the records.
    EXPECT_EQ(Bytes(read_secret), Bytes(client_log["SERVER_TRAFFIC_SECRET_0"]));
    EXPECT_EQ(Bytes(write_secret),
              Bytes(client_log["CLIENT_TRAFFIC_SECRET_0"]));
  } else {
    EXPECT_THAT(client_log, ElementsAre(Key("CLIENT_RANDOM")));

    size_t len =
        SSL_SESSION_get_master_key(SSL_get0_session(client_.get()), nullptr, 0);
    std::vector<uint8_t> expected(len);
    ASSERT_EQ(SSL_SESSION_get_master_key(SSL_get0_session(client_.get()),
                                         expected.data(), expected.size()),
              expected.size());
    EXPECT_EQ(Bytes(expected), Bytes(client_log["CLIENT_RANDOM"]));
  }

  // The server should have logged the same secrets as the client.
  EXPECT_EQ(client_log, server_log);
}